

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall
FpgaIO::PromReadBlock25AA128(FpgaIO *this,uint16_t addr,quadlet_t *data,uint nquads,uchar chan)

{
  BasePort *pBVar1;
  PromType type;
  int iVar2;
  nodeaddr_t nVar3;
  
  if (nquads - 0x11 < 0xfffffff0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"invalid number of quadlets",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  else {
    type = PROM_25AA128_1;
    if (chan != '\x01') {
      type = (uint)(chan == '\x02') * 2 + PROM_25AA128;
    }
    nVar3 = GetPromAddress(this,type,true);
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar3,
                       (ulong)(nquads - 1 | (uint)addr << 8 | 0xfe000000));
    if ((char)iVar2 != '\0') {
      pBVar1 = (this->super_BoardIO).port;
      iVar2 = (*pBVar1->_vptr_BasePort[0x26])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar3 | 0x100,data,
                         (ulong)(nquads << 2));
      return SUB41(iVar2,0);
    }
  }
  return false;
}

Assistant:

bool FpgaIO::PromReadBlock25AA128(uint16_t addr, quadlet_t *data, unsigned int nquads, unsigned char chan)
{
    // nquads sanity check
    if (nquads == 0 || nquads > 16) {
        std::cout << "invalid number of quadlets" << std::endl;
        return false;
    }

    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;

    // trigger read
    quadlet_t write_data = 0xFE000000|(addr << 8)|(nquads-1);
    nodeaddr_t address = GetPromAddress(prom_type, true);
    if (!port->WriteQuadlet(BoardId, address, write_data))
        return false;

    // get result
    if (!port->ReadBlock(BoardId, (address|0x0100), data, nquads * 4))
        return false;
    else
        return true;
}